

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LWOMaterial.cpp
# Opt level: O1

void __thiscall
Assimp::LWOImporter::ConvertMaterial(LWOImporter *this,Surface *surf,aiMaterial *pcMat)

{
  _List_node_base *p_Var1;
  float fVar2;
  ulong __n;
  bool bVar3;
  int iVar4;
  Logger *pLVar5;
  float fVar6;
  float *pInput;
  _List_node_base *p_Var7;
  int i;
  float f;
  aiColor3D clr;
  int m_;
  aiString st;
  uint local_5e4;
  float local_5e0;
  undefined4 uStack_5dc;
  undefined1 local_5d0 [20];
  float local_5bc;
  float local_5b8;
  float local_5b4;
  float local_5b0 [28];
  ios_base local_540 [268];
  aiString local_434;
  
  local_434.length = 0;
  local_434.data[0] = '\0';
  memset(local_434.data + 1,0x1b,0x3ff);
  __n = (surf->mName)._M_string_length;
  if (__n < 0x400) {
    local_434.length = (ai_uint32)__n;
    memcpy(local_434.data,(surf->mName)._M_dataplus._M_p,__n);
    local_434.data[__n] = '\0';
  }
  aiMaterial::AddProperty(pcMat,&local_434,"?mat.name",0,0);
  local_5e4 = (uint)surf->bDoubleSided;
  aiMaterial::AddBinaryProperty(pcMat,&local_5e4,4,"$mat.twosided",0,0,aiPTI_Integer);
  aiMaterial::AddBinaryProperty(pcMat,&surf->mIOR,4,"$mat.refracti",0,0,aiPTI_Float);
  aiMaterial::AddBinaryProperty(pcMat,&surf->mBumpIntensity,4,"$mat.bumpscaling",0,0,aiPTI_Float);
  fVar6 = 2.8026e-45;
  if ((surf->mSpecularValue != 0.0) || (NAN(surf->mSpecularValue))) {
    fVar2 = surf->mGlossiness;
    if ((fVar2 != 0.0) || (NAN(fVar2))) {
      if (this->mIsLWO2 == true) {
        local_5b0[0] = fVar2 * 10.0 + 2.0;
        local_5b0[0] = local_5b0[0] * local_5b0[0];
      }
      else if (fVar2 <= 16.0) {
        local_5b0[0] = 6.0;
      }
      else if (fVar2 <= 64.0) {
        local_5b0[0] = 20.0;
      }
      else if (fVar2 <= 256.0) {
        local_5b0[0] = 50.0;
      }
      else {
        local_5b0[0] = 80.0;
      }
      aiMaterial::AddBinaryProperty
                (pcMat,&surf->mSpecularValue,4,"$mat.shinpercent",0,0,aiPTI_Float);
      aiMaterial::AddBinaryProperty(pcMat,local_5b0,4,"$mat.shininess",0,0,aiPTI_Float);
      fVar6 = 4.2039e-45;
    }
  }
  fVar2 = surf->mColorHighlights;
  local_5bc = ((surf->mColor).r + -1.0) * fVar2 + 1.0;
  local_5b8 = ((surf->mColor).g + -1.0) * fVar2 + 1.0;
  local_5b4 = ((surf->mColor).b + -1.0) * fVar2 + 1.0;
  aiMaterial::AddBinaryProperty(pcMat,&local_5bc,0xc,"$clr.specular",0,0,aiPTI_Float);
  aiMaterial::AddBinaryProperty(pcMat,&surf->mSpecularValue,4,"$mat.shinpercent",0,0,aiPTI_Float);
  local_5bc = surf->mLuminosity * 0.8;
  local_5b8 = local_5bc;
  local_5b4 = local_5bc;
  aiMaterial::AddBinaryProperty(pcMat,&local_5bc,0xc,"$clr.emissive",0,0,aiPTI_Float);
  if ((surf->mAdditiveTransparency != 0.0) || (NAN(surf->mAdditiveTransparency))) {
    pInput = &surf->mAdditiveTransparency;
    local_5b0[0] = 1.4013e-45;
  }
  else {
    fVar2 = surf->mTransparency;
    if ((fVar2 == 1e+11) && (!NAN(fVar2))) goto LAB_00447135;
    local_5b0[0] = 0.0;
    local_5e0 = 1.0 - fVar2;
    pInput = &local_5e0;
  }
  aiMaterial::AddBinaryProperty(pcMat,pInput,4,"$mat.opacity",0,0,aiPTI_Float);
  aiMaterial::AddBinaryProperty(pcMat,local_5b0,4,"$mat.blend",0,0,aiPTI_Integer);
LAB_00447135:
  bVar3 = HandleTextures(this,pcMat,&surf->mColorTextures,aiTextureType_DIFFUSE);
  if (!bVar3) {
    HandleTextures(this,pcMat,&surf->mDiffuseTextures,aiTextureType_DIFFUSE);
  }
  HandleTextures(this,pcMat,&surf->mSpecularTextures,aiTextureType_SPECULAR);
  HandleTextures(this,pcMat,&surf->mGlossinessTextures,aiTextureType_SHININESS);
  HandleTextures(this,pcMat,&surf->mBumpTextures,aiTextureType_HEIGHT);
  HandleTextures(this,pcMat,&surf->mOpacityTextures,aiTextureType_OPACITY);
  HandleTextures(this,pcMat,&surf->mReflectionTextures,aiTextureType_REFLECTION);
  p_Var7 = (_List_node_base *)&surf->mShaders;
  do {
    p_Var7 = (((_List_base<Assimp::LWO::Shader,_std::allocator<Assimp::LWO::Shader>_> *)
              &p_Var7->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    if (p_Var7 == (_List_node_base *)&surf->mShaders) break;
    p_Var1 = p_Var7 + 3;
    iVar4 = std::__cxx11::string::compare((char *)p_Var1);
    if (iVar4 == 0) {
LAB_004472d9:
      pLVar5 = DefaultLogger::get();
      Logger::info(pLVar5,"LWO2: Mapping LW_SuperCelShader/AH_CelShader to aiShadingMode_Toon");
      fVar6 = 7.00649e-45;
LAB_0044730d:
      bVar3 = false;
    }
    else {
      iVar4 = std::__cxx11::string::compare((char *)p_Var1);
      if (iVar4 == 0) goto LAB_004472d9;
      iVar4 = std::__cxx11::string::compare((char *)p_Var1);
      if (iVar4 == 0) {
LAB_004472f4:
        pLVar5 = DefaultLogger::get();
        Logger::info(pLVar5,"LWO2: Mapping LW_RealFresnel/LW_FastFresnel to aiShadingMode_Fresnel");
        fVar6 = 1.4013e-44;
        goto LAB_0044730d;
      }
      iVar4 = std::__cxx11::string::compare((char *)p_Var1);
      if (iVar4 == 0) goto LAB_004472f4;
      pLVar5 = DefaultLogger::get();
      Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
      basic_formatter<char[31]>
                ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5b0,
                 (char (*) [31])"LWO2: Unknown surface shader: ");
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_5b0,(char *)p_Var7[3]._M_next,(long)p_Var7[3]._M_prev);
      std::__cxx11::stringbuf::str();
      Logger::warn(pLVar5,(char *)CONCAT44(uStack_5dc,local_5e0));
      if ((undefined1 *)CONCAT44(uStack_5dc,local_5e0) != local_5d0) {
        operator_delete((undefined1 *)CONCAT44(uStack_5dc,local_5e0));
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_5b0);
      std::ios_base::~ios_base(local_540);
      bVar3 = true;
    }
  } while (bVar3);
  local_5b0[0] = 1.4013e-45;
  if (0.0 < surf->mMaximumSmoothAngle) {
    local_5b0[0] = fVar6;
  }
  aiMaterial::AddBinaryProperty(pcMat,local_5b0,4,"$mat.shadingm",0,0,aiPTI_Integer);
  local_5b4 = surf->mDiffuseValue;
  local_5bc = (surf->mColor).r * local_5b4;
  local_5b8 = (surf->mColor).g * local_5b4;
  local_5b4 = (surf->mColor).b * local_5b4;
  aiMaterial::AddBinaryProperty(pcMat,&local_5bc,0xc,"$clr.diffuse",0,0,aiPTI_Float);
  return;
}

Assistant:

void LWOImporter::ConvertMaterial(const LWO::Surface& surf,aiMaterial* pcMat)
{
    // copy the name of the surface
    aiString st;
    st.Set(surf.mName);
    pcMat->AddProperty(&st,AI_MATKEY_NAME);

    const int i = surf.bDoubleSided ? 1 : 0;
    pcMat->AddProperty(&i,1,AI_MATKEY_TWOSIDED);

    // add the refraction index and the bump intensity
    pcMat->AddProperty(&surf.mIOR,1,AI_MATKEY_REFRACTI);
    pcMat->AddProperty(&surf.mBumpIntensity,1,AI_MATKEY_BUMPSCALING);

    aiShadingMode m;
    if (surf.mSpecularValue && surf.mGlossiness)
    {
        float fGloss;
        if (mIsLWO2)    {
            fGloss = std::pow( surf.mGlossiness*ai_real( 10.0 )+ ai_real( 2.0 ), ai_real( 2.0 ) );
        }
        else
        {
            if (16.0 >= surf.mGlossiness)
                fGloss = 6.0;
            else if (64.0 >= surf.mGlossiness)
                fGloss = 20.0;
            else if (256.0 >= surf.mGlossiness)
                fGloss = 50.0;
            else fGloss = 80.0;
        }

        pcMat->AddProperty(&surf.mSpecularValue,1,AI_MATKEY_SHININESS_STRENGTH);
        pcMat->AddProperty(&fGloss,1,AI_MATKEY_SHININESS);
        m = aiShadingMode_Phong;
    }
    else m = aiShadingMode_Gouraud;

    // specular color
    aiColor3D clr = lerp( aiColor3D(1.0,1.0,1.0), surf.mColor, surf.mColorHighlights );
    pcMat->AddProperty(&clr,1,AI_MATKEY_COLOR_SPECULAR);
    pcMat->AddProperty(&surf.mSpecularValue,1,AI_MATKEY_SHININESS_STRENGTH);

    // emissive color
    // luminosity is not really the same but it affects the surface in a similar way. Some scaling looks good.
    clr.g = clr.b = clr.r = surf.mLuminosity*ai_real( 0.8 );
    pcMat->AddProperty<aiColor3D>(&clr,1,AI_MATKEY_COLOR_EMISSIVE);

    // opacity ... either additive or default-blended, please
    if (0.0 != surf.mAdditiveTransparency)  {
        const int add = aiBlendMode_Additive;
        pcMat->AddProperty(&surf.mAdditiveTransparency,1,AI_MATKEY_OPACITY);
        pcMat->AddProperty(&add,1,AI_MATKEY_BLEND_FUNC);
    } else if (10e10f != surf.mTransparency)  {
        const int def = aiBlendMode_Default;
        const float f = 1.0f-surf.mTransparency;
        pcMat->AddProperty(&f,1,AI_MATKEY_OPACITY);
        pcMat->AddProperty(&def,1,AI_MATKEY_BLEND_FUNC);
    }


    // ADD TEXTURES to the material
    // TODO: find out how we can handle COLOR textures correctly...
    bool b = HandleTextures(pcMat,surf.mColorTextures,aiTextureType_DIFFUSE);
    b = (b || HandleTextures(pcMat,surf.mDiffuseTextures,aiTextureType_DIFFUSE));
    HandleTextures(pcMat,surf.mSpecularTextures,aiTextureType_SPECULAR);
    HandleTextures(pcMat,surf.mGlossinessTextures,aiTextureType_SHININESS);
    HandleTextures(pcMat,surf.mBumpTextures,aiTextureType_HEIGHT);
    HandleTextures(pcMat,surf.mOpacityTextures,aiTextureType_OPACITY);
    HandleTextures(pcMat,surf.mReflectionTextures,aiTextureType_REFLECTION);

    // Now we need to know which shader to use .. iterate through the shader list of
    // the surface and  search for a name which we know ...
    for (const auto &shader : surf.mShaders)   {
        if (shader.functionName == "LW_SuperCelShader" || shader.functionName == "AH_CelShader")  {
            ASSIMP_LOG_INFO("LWO2: Mapping LW_SuperCelShader/AH_CelShader to aiShadingMode_Toon");

            m = aiShadingMode_Toon;
            break;
        }
        else if (shader.functionName == "LW_RealFresnel" || shader.functionName == "LW_FastFresnel")  {
            ASSIMP_LOG_INFO("LWO2: Mapping LW_RealFresnel/LW_FastFresnel to aiShadingMode_Fresnel");

            m = aiShadingMode_Fresnel;
            break;
        }
        else
        {
            ASSIMP_LOG_WARN_F("LWO2: Unknown surface shader: ", shader.functionName);
        }
    }
    if (surf.mMaximumSmoothAngle <= 0.0)
        m = aiShadingMode_Flat;
    int m_ = static_cast<int>(m);
    pcMat->AddProperty(&m_, 1, AI_MATKEY_SHADING_MODEL);

    // (the diffuse value is just a scaling factor)
    // If a diffuse texture is set, we set this value to 1.0
    clr = (b && false ? aiColor3D(1.0,1.0,1.0) : surf.mColor);
    clr.r *= surf.mDiffuseValue;
    clr.g *= surf.mDiffuseValue;
    clr.b *= surf.mDiffuseValue;
    pcMat->AddProperty<aiColor3D>(&clr,1,AI_MATKEY_COLOR_DIFFUSE);
}